

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.cpp
# Opt level: O3

void __thiscall backend::Backend::do_mir_to_arm_transform(Backend *this)

{
  optional<arm::ArmCode> *this_00;
  undefined8 uVar1;
  Function *pFVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  Tag *in_RSI;
  char *pcVar5;
  ArmCode *__args;
  MirPackage *pMVar6;
  _Rb_tree_header *p_Var7;
  Function arm_f;
  Codegen cg;
  ostream local_391;
  _Head_base<0UL,_arm::Function_*,_false> local_390;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *local_388;
  undefined1 local_380 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  undefined1 local_340 [16];
  _Base_ptr p_Stack_330;
  undefined1 local_328 [8];
  undefined1 auStack_320 [40];
  Function local_2f8;
  undefined **local_270;
  undefined8 local_268;
  undefined1 local_260;
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  Function local_220 [3];
  
  local_270 = (undefined **)CONCAT71(local_270._1_7_,2);
  AixLog::operator<<((ostream *)&local_270,(Severity *)in_RSI);
  local_2f8.name._M_dataplus._M_p = (pointer)&local_2f8.name.field_2;
  local_2f8.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Tag_001eaf88;
  local_2f8.name._M_string_length = 0;
  local_2f8.name.field_2._M_local_buf[0] = '\0';
  local_2f8.inst.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
  AixLog::operator<<((ostream *)(auStack_320 + 0x28),in_RSI);
  local_368._8_8_ = std::chrono::_V2::system_clock::now();
  local_368._M_allocated_capacity = (size_type)&PTR__Timestamp_001eaf58;
  local_358[0] = 0;
  AixLog::operator<<((ostream *)local_368._M_local_buf,(Timestamp *)in_RSI);
  pFVar2 = (Function *)(local_340 + 8);
  local_348 = (undefined1  [8])pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"do_mir_to_arm_transform","");
  pcVar5 = "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/backend.cpp";
  local_390._M_head_impl = (Function *)local_380;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/backend.cpp"
             ,"");
  local_258._8_8_ = local_240;
  local_258._0_8_ = &PTR__Function_001eafb8;
  if (local_348 == (undefined1  [8])pFVar2) {
    local_240._8_8_ = p_Stack_330;
  }
  else {
    local_258._8_8_ = local_348;
  }
  local_240._0_8_ = local_340._8_8_;
  local_230._0_8_ = local_220;
  local_248 = (undefined1  [8])local_340._0_8_;
  local_340._0_8_ = (pointer)0x0;
  local_340._8_8_ = local_340._8_8_ & 0xffffffffffffff00;
  if (local_390._M_head_impl == (Function *)local_380) {
    local_220[0].name._M_dataplus._M_p = (pointer)local_380._8_8_;
  }
  else {
    local_230._0_8_ = local_390._M_head_impl;
  }
  local_220[0].super_Displayable._vptr_Displayable._1_7_ = local_380._1_7_;
  local_220[0].super_Displayable._vptr_Displayable._0_1_ = local_380[0];
  local_230._8_8_ = local_388;
  local_388 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)0x0;
  local_380[0] = 0;
  local_220[0].name._M_string_length = 0x42;
  local_220[0].name.field_2._M_local_buf[0] = false;
  local_390._M_head_impl = (Function *)local_380;
  local_348 = (undefined1  [8])pFVar2;
  AixLog::operator<<((ostream *)local_258,(Function *)pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"Doing  mir->arm  transform\n",0x1b);
  AixLog::Function::~Function((Function *)local_258);
  if (local_390._M_head_impl != (Function *)local_380) {
    operator_delete(local_390._M_head_impl,CONCAT71(local_380._1_7_,local_380[0]) + 1);
  }
  if (local_348 != (undefined1  [8])pFVar2) {
    operator_delete((void *)local_348,(ulong)(local_340._8_8_ + 1));
  }
  local_2f8.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Tag_001eaf88;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.name._M_dataplus._M_p != &local_2f8.name.field_2) {
    operator_delete(local_2f8.name._M_dataplus._M_p,
                    CONCAT71(local_2f8.name.field_2._M_allocated_capacity._1_7_,
                             local_2f8.name.field_2._M_local_buf[0]) + 1);
  }
  local_328 = (undefined1  [8])0x0;
  auStack_320._0_8_ = (_func_int **)0x0;
  local_348 = (undefined1  [8])&PTR_display_001edaf8;
  local_340._0_8_ = (pointer)0x0;
  local_340._8_8_ = (pointer)0x0;
  p_Stack_330 = (_Base_ptr)0x0;
  auStack_320._16_8_ = auStack_320;
  auStack_320._8_8_ = (_Base_ptr)0x0;
  auStack_320._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pMVar6 = this->package;
  p_Var3 = (pMVar6->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(pMVar6->functions)._M_t._M_impl.super__Rb_tree_header;
  local_380._16_8_ = this;
  auStack_320._24_8_ = auStack_320._16_8_;
  if ((_Rb_tree_header *)p_Var3 != p_Var7) {
    do {
      if (*(char *)&p_Var3[3]._M_parent[1]._M_left == '\0') {
        codegen::Codegen::Codegen
                  ((Codegen *)local_258,(MirFunction *)(p_Var3 + 2),*(MirPackage **)local_380._16_8_
                   ,&this->extra_data,
                   (*(Options **)(local_380._16_8_ + 0x60))->allow_conditional_exec);
        codegen::Codegen::translate_function((Function *)(auStack_320 + 0x28),(Codegen *)local_258);
        pFVar2 = (Function *)operator_new(0x88);
        arm::Function::Function(pFVar2,(Function *)(auStack_320 + 0x28));
        local_390._M_head_impl = pFVar2;
        std::
        vector<std::unique_ptr<arm::Function,std::default_delete<arm::Function>>,std::allocator<std::unique_ptr<arm::Function,std::default_delete<arm::Function>>>>
        ::emplace_back<std::unique_ptr<arm::Function,std::default_delete<arm::Function>>>
                  ((vector<std::unique_ptr<arm::Function,std::default_delete<arm::Function>>,std::allocator<std::unique_ptr<arm::Function,std::default_delete<arm::Function>>>>
                    *)local_340,
                   (unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)&local_390);
        if (local_390._M_head_impl != (Function *)0x0) {
          std::default_delete<arm::Function>::operator()
                    ((default_delete<arm::Function> *)&local_390,local_390._M_head_impl);
        }
        if (local_2f8.ty.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_2f8.ty.
                     super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
        ::~_Rb_tree(&local_2f8.local_const._M_t);
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::~vector(&local_2f8.inst);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8.name._M_dataplus._M_p != &local_2f8.name.field_2) {
          operator_delete(local_2f8.name._M_dataplus._M_p,
                          CONCAT71(local_2f8.name.field_2._M_allocated_capacity._1_7_,
                                   local_2f8.name.field_2._M_local_buf[0]) + 1);
        }
        codegen::Codegen::~Codegen((Codegen *)local_258);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var7);
    pMVar6 = *(MirPackage **)local_380._16_8_;
  }
  p_Var4 = (pMVar6->global_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(pMVar6->global_values)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var7) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
      ::pair<arm::ConstValue_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
                  *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1),
                 (ConstValue *)(p_Var4 + 2));
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,arm::ConstValue>,std::_Select1st<std::pair<std::__cxx11::string_const,arm::ConstValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,arm::ConstValue>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,arm::ConstValue>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,arm::ConstValue>,std::_Select1st<std::pair<std::__cxx11::string_const,arm::ConstValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,arm::ConstValue>>>
                  *)local_328,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
                  *)local_258);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_220[0].name._M_string_length & 0xff]._M_data)
                ((anon_class_1_0_00000001 *)(auStack_320 + 0x28),
                 (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_240 + 0x10));
      local_220[0].name._M_string_length = CONCAT71(local_220[0].name._M_string_length._1_7_,0xff);
      if ((MirFunction *)local_258._0_8_ != (MirFunction *)local_248) {
        operator_delete((void *)local_258._0_8_,(ulong)((long)local_248 + 1));
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var7);
  }
  uVar1 = local_380._16_8_;
  this_00 = (optional<arm::ArmCode> *)(local_380._16_8_ + 8);
  __args = (ArmCode *)local_348;
  std::optional<arm::ArmCode>::emplace<arm::ArmCode>(this_00,__args);
  if ((*(Options **)(uVar1 + 0x60))->show_code_after_each_pass != false) {
    local_391 = (ostream)0x2;
    AixLog::operator<<(&local_391,(Severity *)__args);
    local_2f8.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Tag_001eaf88;
    local_2f8.name._M_dataplus._M_p = (pointer)&local_2f8.name.field_2;
    local_2f8.name._M_string_length = 0;
    local_2f8.name.field_2._M_local_buf[0] = '\0';
    local_2f8.inst.
    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
    AixLog::operator<<((ostream *)(auStack_320 + 0x28),(Tag *)__args);
    local_268 = std::chrono::_V2::system_clock::now();
    local_270 = &PTR__Timestamp_001eaf58;
    local_260 = 0;
    AixLog::operator<<((ostream *)&local_270,(Timestamp *)__args);
    local_390._M_head_impl = (Function *)local_380;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_390,"do_mir_to_arm_transform","");
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/backend.cpp";
    local_368._M_allocated_capacity = (size_type)(Function *)local_358;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/backend.cpp"
               ,"");
    local_258._0_8_ = &PTR__Function_001eafb8;
    local_258._8_8_ = local_240;
    if (local_390._M_head_impl == (Function *)local_380) {
      local_240._8_8_ = local_380._8_8_;
    }
    else {
      local_258._8_8_ = local_390._M_head_impl;
    }
    local_240._1_7_ = local_380._1_7_;
    local_240[0] = local_380[0];
    local_248 = (undefined1  [8])local_388;
    local_388 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                 *)0x0;
    local_380[0] = 0;
    if ((Function *)local_368._M_allocated_capacity == (Function *)local_358) {
      local_220[0].name._M_dataplus._M_p = (pointer)local_358._8_8_;
      local_230._0_8_ = local_220;
    }
    else {
      local_230._0_8_ = local_368._M_allocated_capacity;
    }
    local_220[0].super_Displayable._vptr_Displayable._1_7_ = local_358._1_7_;
    local_220[0].super_Displayable._vptr_Displayable._0_1_ = local_358[0];
    local_230._8_8_ = local_368._8_8_;
    local_368._8_8_ = 0;
    local_358[0] = 0;
    local_220[0].name._M_string_length = 0x50;
    local_220[0].name.field_2._M_local_buf[0] = false;
    local_390._M_head_impl = (Function *)local_380;
    local_368._M_allocated_capacity = (size_type)(Function *)local_358;
    AixLog::operator<<((ostream *)local_258,(Function *)pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Code after transformation\n",0x1a);
    AixLog::Function::~Function((Function *)local_258);
    if ((Function *)local_368._M_allocated_capacity != (Function *)local_358) {
      operator_delete((void *)local_368._M_allocated_capacity,
                      CONCAT71(local_358._1_7_,local_358[0]) + 1);
    }
    if (local_390._M_head_impl != (Function *)local_380) {
      operator_delete(local_390._M_head_impl,CONCAT71(local_380._1_7_,local_380[0]) + 1);
    }
    local_2f8.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Tag_001eaf88;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.name._M_dataplus._M_p != &local_2f8.name.field_2) {
      operator_delete(local_2f8.name._M_dataplus._M_p,
                      CONCAT71(local_2f8.name.field_2._M_allocated_capacity._1_7_,
                               local_2f8.name.field_2._M_local_buf[0]) + 1);
    }
    if ((((optional<arm::ArmCode> *)(uVar1 + 8))->super__Optional_base<arm::ArmCode,_false,_false>).
        _M_payload.super__Optional_payload<arm::ArmCode,_true,_false,_false>.
        super__Optional_payload_base<arm::ArmCode>._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    (*(code *)**(undefined8 **)
                &(this_00->super__Optional_base<arm::ArmCode,_false,_false>)._M_payload.
                 super__Optional_payload<arm::ArmCode,_true,_false,_false>.
                 super__Optional_payload_base<arm::ArmCode>._M_payload)(this_00,&std::cout);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
               *)local_328);
  std::
  vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
  ::~vector((vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
             *)local_340);
  return;
}

Assistant:

void Backend::do_mir_to_arm_transform() {
  LOG(INFO) << ("Doing  mir->arm  transform\n");
  auto code = arm::ArmCode();
  for (auto& f : package.functions) {
    if (f.second.type->is_extern) continue;
    auto cg = codegen::Codegen(f.second, package, extra_data,
                               options.allow_conditional_exec);
    auto arm_f = cg.translate_function();
    code.functions.push_back(std::make_unique<arm::Function>(std::move(arm_f)));
  }
  for (auto& v : package.global_values) {
    code.consts.insert({v.first, v.second});
  }
  arm_code.emplace(std::move(code));
  if (options.show_code_after_each_pass) {
    LOG(INFO) << ("Code after transformation\n");
    std::cout << arm_code.value() << std::endl;
  }
}